

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O0

StateResult __thiscall
anon_unknown.dwarf_2857::HashSeedStorage::initialize(HashSeedStorage *this,int which)

{
  char *__s;
  size_t sVar1;
  int in_ESI;
  long in_FS_OFFSET;
  QSimpleParsedNumber<long_long> QVar2;
  StateResult SVar3;
  int i;
  char *seedstr;
  QSimpleParsedNumber<long_long> r;
  StateResult result;
  InitialRandomData x;
  unsigned_long_long in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffffac;
  int iVar4;
  undefined4 in_stack_ffffffffffffffb8;
  quintptr local_28;
  undefined4 local_20;
  quintptr local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  local_20 = 0xffffffff;
  __s = getenv("QT_HASH_SEED");
  if (__s != (char *)0x0) {
    strlen(__s);
    QVar2 = qstrntoll((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),(qsizetype)__s,
                      in_stack_ffffffffffffffac);
    if ((0 < QVar2.used) && (sVar1 = strlen(__s), QVar2.used == sVar1)) {
      if (QVar2.result != 0) {
        fprintf(_stderr,"QT_HASH_SEED: forced seed value is not 0; ignored.\n");
      }
      goto LAB_001f02f5;
    }
  }
  local_18[1] = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_18[0] = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (quintptr  [2])qt_initial_random_value();
  for (iVar4 = 0; iVar4 < 2; iVar4 = iVar4 + 1) {
    QBasicAtomicInteger<unsigned_long_long>::storeRelaxed
              ((QBasicAtomicInteger<unsigned_long_long> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    if (in_ESI == iVar4) {
      local_28 = local_18[iVar4];
    }
  }
  local_20 = 0;
LAB_001f02f5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  SVar3.state = local_20;
  SVar3.requestedSeed = local_28;
  SVar3._12_4_ = 0;
  return SVar3;
}

Assistant:

[[maybe_unused]] HashSeedStorage::StateResult HashSeedStorage::initialize(int which) noexcept
{
    StateResult result = { 0, OverriddenByEnvironment };
#ifdef QT_BOOTSTRAPPED
    Q_UNUSED(which);
    Q_UNREACHABLE_RETURN(result);
#else
    // can't use qEnvironmentVariableIntValue (reentrancy)
    const char *seedstr = getenv("QT_HASH_SEED");
    if (seedstr) {
        auto r = qstrntoll(seedstr, strlen(seedstr), 10);
        if (r.used > 0 && size_t(r.used) == strlen(seedstr)) {
            if (r.result) {
                // can't use qWarning here (reentrancy)
                fprintf(stderr, "QT_HASH_SEED: forced seed value is not 0; ignored.\n");
            }

            // we don't have to store to the seed, since it's pre-initialized by
            // the compiler to zero
            return result;
        }
    }

    // update the full seed
    auto x = qt_initial_random_value();
    for (int i = 0; i < SeedCount; ++i) {
        seeds[i].storeRelaxed(x.data[i]);
        if (which == i)
            result.requestedSeed = x.data[i];
    }
    result.state = JustInitialized;
    return result;
#endif
}